

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O2

void __thiscall
LumaQuantizer::setQuantizer
          (LumaQuantizer *this,ptf_t ptf,uint bitdepth,colorSpace_t cs,uint bitdepthC,float maxLum,
          float minLum)

{
  uint uVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  
  if (this->m_mapping != (float *)0x0) {
    operator_delete__(this->m_mapping);
  }
  this->m_bitdepth = bitdepth;
  fVar4 = exp2f((float)bitdepth);
  this->m_maxVal = (int)fVar4 - 1;
  this->m_colorSpace = cs;
  this->m_bitdepthColor = bitdepthC;
  fVar4 = exp2f((float)bitdepthC);
  this->m_maxValColor = (int)fVar4 - 1;
  this->m_Lmax = maxLum;
  this->m_Lmin = minLum;
  uVar1 = this->m_maxVal;
  pfVar2 = (float *)operator_new__((ulong)(uVar1 + 1) << 2);
  this->m_mapping = pfVar2;
  switch(ptf) {
  case PTF_PQ:
    setMappingPQ(this);
    return;
  case PTF_LOG:
    setMappingLog(this);
    return;
  case PTF_JND_HDRVDP:
    setMappingJNDHDRVDP(this);
    return;
  case PTF_LINEAR:
    break;
  default:
    setMappingPsi(this);
    return;
  }
  for (lVar3 = 0; (ulong)uVar1 + 1 != lVar3; lVar3 = lVar3 + 1) {
    pfVar2[lVar3] = ((float)lVar3 / (float)uVar1) * maxLum;
  }
  return;
}

Assistant:

void LumaQuantizer::setQuantizer(ptf_t ptf, unsigned int bitdepth,
                                 colorSpace_t cs, unsigned int bitdepthC,
                                 float maxLum, float minLum)
{
    if (m_mapping != NULL)
        delete[] m_mapping;
    
    m_bitdepth = bitdepth;
    m_maxVal = (int)pow(2.0f,(float)bitdepth)-1;
    m_colorSpace = cs;
    m_bitdepthColor = bitdepthC;
    m_maxValColor = (int)pow(2.0f,(float)bitdepthC)-1;
    m_Lmax = maxLum;
    m_Lmin = minLum;
    
    m_mapping = new float[m_maxVal+1];
    
    switch (ptf)
    {
    case PTF_PQ:
        setMappingPQ();
        break;
    case PTF_LOG:
        setMappingLog();
        break;
    case PTF_JND_HDRVDP:
        setMappingJNDHDRVDP();
        break;
    case PTF_LINEAR:
        for (size_t i=0; i<=m_maxVal; i++)
	        m_mapping[i] = m_Lmax*((float)i/m_maxVal);
	    break;
    case PTF_PSI:
    default:
        setMappingPsi();
        break;
    }
    
    //for (int i = 0; i<=m_maxVal; i++)
    //    fprintf(stderr, "%0.8f, ", m_mapping[i]);
}